

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderVoting(CHud *this)

{
  CUIRect Bars;
  bool bVar1;
  int iVar2;
  uint uVar3;
  IClient *this_00;
  ITextRender *pIVar4;
  char *pcVar5;
  CUI *this_01;
  CTextCursor *this_02;
  char *pcVar6;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar7;
  int SecondsLeft;
  CUIRect Base;
  CUIRect Rect;
  char aBufNo [64];
  char aBufYes [64];
  char aBuf [512];
  undefined4 in_stack_fffffffffffffcc8;
  uint in_stack_fffffffffffffccc;
  CVoting *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  CTextCursor *pBindStr;
  CVoting *in_stack_fffffffffffffce0;
  CBinds *this_03;
  undefined8 in_stack_fffffffffffffce8;
  CTextCursor *in_stack_fffffffffffffcf0;
  char *pText;
  CUIRect *in_stack_fffffffffffffcf8;
  CUIRect *pRect;
  undefined8 in_stack_fffffffffffffd38;
  vec4 *in_stack_fffffffffffffd40;
  CUIRect *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd58;
  char local_248 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CVoting::IsVoting(in_stack_fffffffffffffce0);
  if (bVar1) {
    this_00 = CComponent::Client((CComponent *)0x16753b);
    iVar2 = IClient::State(this_00);
    if (iVar2 != 4) {
      vector4_base<float>::vector4_base
                ((vector4_base<float> *)&stack0xfffffffffffffd58,0.0,0.0,0.0,0.4);
      CUIRect::Draw(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                    (float)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38
                   );
      pIVar4 = CComponent::TextRender((CComponent *)0x1675b5);
      (*(pIVar4->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f800000);
      uVar3 = CVoting::SecondsLeft(in_stack_fffffffffffffcd0);
      pcVar5 = Localize((char *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      str_format(&stack0xfffffffffffffdf8,0x200,pcVar5,(ulong)uVar3);
      if ((RenderVoting()::s_TimerCursor == '\0') &&
         (iVar2 = __cxa_guard_acquire(&RenderVoting()::s_TimerCursor), iVar2 != 0)) {
        CTextCursor::CTextCursor
                  (in_stack_fffffffffffffcf0,(float)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                   (float)in_stack_fffffffffffffce8,
                   (float)((ulong)in_stack_fffffffffffffce0 >> 0x20),(int)in_stack_fffffffffffffce0)
        ;
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderVoting::s_TimerCursor,&__dso_handle);
        __cxa_guard_release(&RenderVoting()::s_TimerCursor);
      }
      RenderVoting::s_TimerCursor.m_Align = 2;
      CLocalizationDatabase::Version(&g_Localization);
      CTextCursor::Reset((CTextCursor *)in_stack_fffffffffffffcd0,
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      pIVar4 = CComponent::TextRender((CComponent *)0x1676c3);
      (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
                (pIVar4,&RenderVoting::s_TimerCursor,&stack0xfffffffffffffdf8,0xffffffff);
      if ((RenderVoting()::s_DescriptionCursor == '\0') &&
         (iVar2 = __cxa_guard_acquire(&RenderVoting()::s_DescriptionCursor), iVar2 != 0)) {
        CTextCursor::CTextCursor
                  (in_stack_fffffffffffffcf0,(float)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                   (float)in_stack_fffffffffffffce8,
                   (float)((ulong)in_stack_fffffffffffffce0 >> 0x20),(int)in_stack_fffffffffffffce0)
        ;
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderVoting::s_DescriptionCursor,&__dso_handle);
        __cxa_guard_release(&RenderVoting()::s_DescriptionCursor);
      }
      fVar7 = CTextCursor::Width(&RenderVoting::s_TimerCursor);
      RenderVoting::s_DescriptionCursor.m_MaxWidth = 100.0 - fVar7;
      RenderVoting::s_DescriptionCursor.m_MaxLines = 3;
      CTextCursor::Reset((CTextCursor *)in_stack_fffffffffffffcd0,
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      this_01 = (CUI *)CComponent::TextRender((CComponent *)0x167795);
      pcVar5 = CVoting::VoteDescription(*(CVoting **)(*(long *)(in_RDI + 8) + 0x1b220));
      (**(code **)(*(long *)this_01 + 0x58))
                (this_01,&RenderVoting::s_DescriptionCursor,pcVar5,0xffffffff);
      if ((RenderVoting()::s_ReasonCursor == '\0') &&
         (iVar2 = __cxa_guard_acquire(&RenderVoting()::s_ReasonCursor), iVar2 != 0)) {
        CTextCursor::CTextCursor
                  (in_stack_fffffffffffffcf0,(float)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                   (float)in_stack_fffffffffffffce8,
                   (float)((ulong)in_stack_fffffffffffffce0 >> 0x20),(int)in_stack_fffffffffffffce0)
        ;
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderVoting::s_ReasonCursor,&__dso_handle);
        __cxa_guard_release(&RenderVoting()::s_ReasonCursor);
      }
      this_02 = (CTextCursor *)Localize((char *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8)
      ;
      pcVar5 = CVoting::VoteReason(*(CVoting **)(*(long *)(in_RDI + 8) + 0x1b220));
      this_03 = (CBinds *)&stack0xfffffffffffffdf8;
      str_format((char *)this_03,0x200,"%s %s",this_02,pcVar5);
      RenderVoting::s_ReasonCursor.m_MaxWidth = 100.0;
      pBindStr = &RenderVoting::s_ReasonCursor;
      CTextCursor::Reset(this_02,CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      pIVar4 = CComponent::TextRender((CComponent *)0x1678bb);
      (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])(pIVar4,pBindStr,this_03,0xffffffff);
      Bars.w = SUB84(in_stack_fffffffffffffd58,0);
      Bars.h = SUB84(in_stack_fffffffffffffd58,4);
      Bars.x = 100.0;
      Bars.y = 4.0;
      CVoting::RenderBars((CVoting *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                          Bars);
      CBinds::GetKey(this_03,(char *)pBindStr,(char *)this_02,in_stack_fffffffffffffccc);
      CBinds::GetKey(this_03,(char *)pBindStr,(char *)this_02,in_stack_fffffffffffffccc);
      pcVar5 = &stack0xfffffffffffffdf8;
      pText = local_248;
      pcVar6 = Localize((char *)this_03,(char *)pBindStr);
      str_format(pcVar5,0x200,"%s - %s",pText,pcVar6);
      CComponent::UI((CComponent *)0x1679df);
      CUI::DoLabel(this_01,in_stack_fffffffffffffcf8,pText,(float)((ulong)pcVar5 >> 0x20),
                   (int)pcVar5,(float)((ulong)this_03 >> 0x20),SUB81((ulong)this_03 >> 0x18,0));
      pRect = (CUIRect *)&stack0xfffffffffffffdf8;
      pcVar6 = Localize((char *)this_03,(char *)pBindStr);
      str_format((char *)pRect,0x200,"%s - %s",pcVar6,&stack0xfffffffffffffd78);
      CComponent::UI((CComponent *)0x167a5c);
      CUI::DoLabel(this_01,pRect,pText,(float)((ulong)pcVar5 >> 0x20),(int)pcVar5,
                   (float)((ulong)this_03 >> 0x20),SUB81((ulong)this_03 >> 0x18,0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderVoting()
{
	if(!m_pClient->m_pVoting->IsVoting() || Client()->State() == IClient::STATE_DEMOPLAYBACK)
		return;

	CUIRect Rect = {-10.0f, 58.0f, 119.0f, 46.0f};
	Rect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.4f));

	TextRender()->TextColor(1,1,1,1);

	char aBuf[512];
	int SecondsLeft = m_pClient->m_pVoting->SecondsLeft();
	str_format(aBuf, sizeof(aBuf), Localize("%ds left"), SecondsLeft);
	static CTextCursor s_TimerCursor(6.0f, 105.0f, 60.0f);
	s_TimerCursor.m_Align = TEXTALIGN_RIGHT;
	s_TimerCursor.Reset(((int64)g_Localization.Version()) << 32 | SecondsLeft);
	TextRender()->TextOutlined(&s_TimerCursor, aBuf, -1);

	static CTextCursor s_DescriptionCursor(6.0f, 5.0f, 60.0f, TEXTFLAG_ELLIPSIS);
	s_DescriptionCursor.m_MaxWidth = 100.0f - s_TimerCursor.Width();
	s_DescriptionCursor.m_MaxLines = 3;
	s_DescriptionCursor.Reset();
	TextRender()->TextOutlined(&s_DescriptionCursor, m_pClient->m_pVoting->VoteDescription(), -1);

	// reason
	static CTextCursor s_ReasonCursor(6.0f, 5.0f, 79.0f, TEXTFLAG_ELLIPSIS);
	str_format(aBuf, sizeof(aBuf), "%s %s", Localize("Reason:"), m_pClient->m_pVoting->VoteReason());
	s_ReasonCursor.m_MaxWidth = 100.0f;
	s_ReasonCursor.Reset();
	TextRender()->TextOutlined(&s_ReasonCursor, aBuf, -1);

	CUIRect Base = {5, 88, 100, 4};
	m_pClient->m_pVoting->RenderBars(Base);

	char aBufYes[64], aBufNo[64];
	m_pClient->m_pBinds->GetKey("vote yes", aBufYes, sizeof(aBufYes));
	m_pClient->m_pBinds->GetKey("vote no", aBufNo, sizeof(aBufNo));
	str_format(aBuf, sizeof(aBuf), "%s - %s", aBufYes, Localize("Vote yes"));
	Base.y += Base.h+1;
	UI()->DoLabel(&Base, aBuf, 6.0f, TEXTALIGN_LEFT);

	str_format(aBuf, sizeof(aBuf), "%s - %s", Localize("Vote no"), aBufNo);
	UI()->DoLabel(&Base, aBuf, 6.0f, TEXTALIGN_RIGHT);
}